

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<const_FBX::Scene,_std::default_delete<const_FBX::Scene>_> __thiscall
FBX::Parser::parseScene(Parser *this)

{
  size_t sVar1;
  long lVar2;
  element_type *peVar3;
  long *plVar4;
  element_type *peVar5;
  element_type *peVar6;
  pointer psVar7;
  pointer psVar8;
  _Head_base<0UL,_const_FBX::Scene_*,_false> _Var9;
  int iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar12;
  size_type *psVar13;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar14;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *this_00;
  long lVar15;
  shared_ptr<FBX::Texture> *texture;
  pointer pNVar16;
  pointer pcVar17;
  pointer psVar18;
  pointer psVar19;
  shared_ptr<FBX::Material> *material;
  Node *in_RSI;
  Settings *pSVar20;
  undefined8 *puVar21;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *pvVar22;
  pointer __p;
  shared_ptr<FBX::Mesh> *mesh;
  pointer psVar23;
  byte bVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float in_XMM1_Da;
  Vector3 up;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> models;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> meshes;
  value_type nodeObjects;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeTextures;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeMaterials;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeModels;
  value_type nodeConnections;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodeGeometry;
  Settings settings;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [4];
  pointer local_260;
  vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> local_258;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_240;
  vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_> local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  double local_1e8 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_1d8;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_1c0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_1a0;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_188;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_170;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [24];
  pointer local_120;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_110;
  vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_> local_f8;
  vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_> local_d8;
  _Head_base<0UL,_const_FBX::Scene_*,_false> local_b8;
  pointer local_b0;
  pointer local_a8;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_a0;
  __uniq_ptr_impl<FBX::Scene,_std::default_delete<FBX::Scene>_> local_88;
  Settings local_80;
  
  bVar24 = 0;
  sVar1 = in_RSI->propertyCount;
  local_208._0_8_ = local_208 + 0x10;
  local_b8._M_head_impl = (Scene *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"GlobalSettings","");
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_158,*(FBX **)(sVar1 + 0x30),
            *(Node **)(sVar1 + 0x38),(string *)local_208);
  Settings::Settings(&local_80,(Node *)local_158._0_8_);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_158);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
  }
  sVar1 = in_RSI->propertyCount;
  local_158._0_8_ = (pointer)(local_158 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Objects","");
  findNodes((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2b0,*(FBX **)(sVar1 + 0x30),
            *(Node **)(sVar1 + 0x38),(string *)local_158);
  local_208._0_8_ = *(undefined8 *)local_2b0._0_8_;
  local_208._8_4_ = (undefined4)*(size_t *)(local_2b0._0_8_ + 8);
  local_208._12_4_ = *(undefined4 *)(local_2b0._0_8_ + 0xc);
  local_1f8._M_allocated_capacity = (size_type)local_1e8;
  pcVar17 = (((string *)(local_2b0._0_8_ + 0x10))->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_208 + 0x10),pcVar17,pcVar17 + *(size_type *)(local_2b0._0_8_ + 0x18));
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_1d8,(vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_2b0._0_8_ + 0x30));
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_1c0,
           (vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
            *)(local_2b0._0_8_ + 0x48));
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)local_2b0);
  if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)(local_148._M_allocated_capacity + 1));
  }
  sVar1 = in_RSI->propertyCount;
  local_2b0._0_8_ = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Connections","");
  findNodes(&local_240,*(FBX **)(sVar1 + 0x30),*(Node **)(sVar1 + 0x38),(string *)local_2b0);
  local_158._0_8_ =
       (local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyCount;
  local_158._8_4_ =
       (undefined4)
       (local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyLength;
  local_158._12_4_ =
       *(undefined4 *)
        ((long)&(local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->propertyLength + 4);
  local_148._M_allocated_capacity = (size_type)local_138;
  pcVar17 = ((local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_158 + 0x10),pcVar17,
             pcVar17 + ((local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl
                         .super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_138 + 0x10),
             &(local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_110,
           &(local_240.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0[0]._M_allocated_capacity + 1));
  }
  local_2b0._0_8_ = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Model","");
  findNodes(&local_170,
            (FBX *)local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                   super__Vector_impl_data._M_start,
            local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,(string *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0[0]._M_allocated_capacity + 1));
  }
  local_2b0._0_8_ = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Geometry","");
  findNodes(&local_a0,
            (FBX *)local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                   super__Vector_impl_data._M_start,
            local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,(string *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0[0]._M_allocated_capacity + 1));
  }
  local_2b0._0_8_ = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Material","");
  findNodes(&local_188,
            (FBX *)local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                   super__Vector_impl_data._M_start,
            local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,(string *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0[0]._M_allocated_capacity + 1));
  }
  local_2b0._0_8_ = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Texture","");
  findNodes(&local_1a0,
            (FBX *)local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                   super__Vector_impl_data._M_start,
            local_1d8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
            super__Vector_impl_data._M_finish,(string *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0[0]._M_allocated_capacity + 1));
  }
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  reserve(&local_d8,
          ((long)local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar16 = local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x48);
      Texture::Texture((Texture *)paVar11,pNVar16);
      local_2b0._0_8_ = paVar11;
      std::vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>::
      emplace_back<FBX::Texture*>
                ((vector<std::shared_ptr<FBX::Texture>,std::allocator<std::shared_ptr<FBX::Texture>>>
                  *)&local_d8,(Texture **)local_2b0);
      pNVar16 = pNVar16 + 1;
    } while (pNVar16 !=
             local_1a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  reserve(&local_f8,
          ((long)local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar16 = local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0xc0);
      Material::Material((Material *)paVar11,pNVar16);
      local_2b0._0_8_ = paVar11;
      std::vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>::
      emplace_back<FBX::Material*>
                ((vector<std::shared_ptr<FBX::Material>,std::allocator<std::shared_ptr<FBX::Material>>>
                  *)&local_f8,(Material **)local_2b0);
      pNVar16 = pNVar16 + 1;
    } while (pNVar16 !=
             local_188.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_228.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar16 = local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar12 = std::
                get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((pNVar16->properties).
                           super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
      iVar10 = std::__cxx11::string::compare((char *)pvVar12);
      if (iVar10 == 0) {
        up.y = (float)extraout_XMM0_Db;
        up.x = (float)extraout_XMM0_Da;
        up.z = in_XMM1_Da;
        parseMesh((Parser *)local_2b0,in_RSI,up);
        std::vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>>::
        emplace_back<std::shared_ptr<FBX::Mesh>>
                  ((vector<std::shared_ptr<FBX::Mesh>,std::allocator<std::shared_ptr<FBX::Mesh>>> *)
                   &local_228,(shared_ptr<FBX::Mesh> *)local_2b0);
        if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0._8_8_);
        }
      }
      pNVar16 = pNVar16 + 1;
    } while (pNVar16 !=
             local_a0.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_258.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::reserve
            (&local_258,
             ((long)local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                    super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if (local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pNVar16 = local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pvVar12 = std::
                get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((pNVar16->properties).
                           super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2);
      iVar10 = std::__cxx11::string::compare((char *)pvVar12);
      if (iVar10 == 0) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x28);
        psVar13 = (size_type *)
                  std::
                  get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                            ((pNVar16->properties).
                             super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
        paVar11->_M_allocated_capacity = *psVar13;
        (((string *)(paVar11->_M_local_buf + 8))->_M_dataplus)._M_p = (pointer)0x0;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar11->_M_local_buf + 0x10))->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(paVar11->_M_local_buf + 0x18))->_M_allocated_capacity = 0;
        *(size_type *)(paVar11->_M_local_buf + 0x20) = 0;
        local_2b0._0_8_ = paVar11;
        std::vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>::
        emplace_back<FBX::Model*>
                  ((vector<std::shared_ptr<FBX::Model>,std::allocator<std::shared_ptr<FBX::Model>>>
                    *)&local_258,(Model **)local_2b0);
      }
      pNVar16 = pNVar16 + 1;
    } while (pNVar16 !=
             local_170.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_b0 = local_120;
  pcVar17 = (pointer)local_138._16_8_;
  if ((pointer)local_138._16_8_ != local_120) {
    do {
      pvVar14 = std::
                get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                            *)(*(long *)(pcVar17 + 0x48) + 0x30));
      lVar15 = *pvVar14;
      pvVar14 = std::
                get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                          ((variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                            *)(*(long *)(pcVar17 + 0x48) + 0x60));
      lVar2 = *pvVar14;
      local_260 = (pointer)local_f8.
                           super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      psVar18 = local_d8.
                super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = pcVar17;
      psVar7 = local_d8.
               super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pNVar16 = (pointer)local_f8.
                         super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      if (local_f8.
          super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_f8.
          super__Vector_base<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          for (; psVar8 = local_258.
                          super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish, psVar18 != psVar7;
              psVar18 = psVar18 + 1) {
            peVar3 = (psVar18->super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            if ((lVar15 == (peVar3->super_Object).id) &&
               (plVar4 = (long *)pNVar16->propertyCount, lVar2 == *plVar4)) {
              plVar4[1] = (long)peVar3;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 2),
                         &(psVar18->super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount);
            }
          }
          if (local_258.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_258.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar19 = local_258.
                      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if ((lVar15 == (((element_type *)pNVar16->propertyCount)->super_Object).id) &&
                 (peVar5 = (psVar19->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr, lVar2 == (peVar5->super_Object).id)) {
                (peVar5->material).super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)pNVar16->propertyCount;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(peVar5->material).
                            super___shared_ptr<FBX::Material,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pNVar16->propertyLength);
              }
              psVar19 = psVar19 + 1;
            } while (psVar19 != psVar8);
          }
          pNVar16 = (pointer)&pNVar16->id;
          psVar18 = local_d8.
                    super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = local_d8.
                   super__Vector_base<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (pNVar16 != local_260);
      }
      local_260 = (pointer)local_228.
                           super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      psVar23 = local_228.
                super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_228.
          super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_228.
          super__Vector_base<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          psVar8 = local_258.
                   super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_258.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_258.
              super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            psVar19 = local_258.
                      super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              peVar6 = (psVar23->super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if ((lVar15 == (peVar6->super_Object).id) &&
                 (peVar5 = (psVar19->super___shared_ptr<FBX::Model,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr, lVar2 == (peVar5->super_Object).id)) {
                (peVar5->mesh).super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     peVar6;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(peVar5->mesh).super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           &(psVar23->super___shared_ptr<FBX::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                            _M_refcount);
              }
              psVar19 = psVar19 + 1;
            } while (psVar19 != psVar8);
          }
          psVar23 = psVar23 + 1;
        } while ((pointer)psVar23 != local_260);
      }
      pcVar17 = local_a8 + 0x60;
    } while (pcVar17 != local_b0);
  }
  this_00 = (vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
            operator_new(0x68);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &local_240,&local_258);
  pSVar20 = &local_80;
  puVar21 = (undefined8 *)local_2b0;
  for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar21 = *(undefined8 *)&pSVar20->upAxis;
    pSVar20 = (Settings *)((long)pSVar20 + ((ulong)bVar24 * -2 + 1) * 8);
    puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
  }
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::vector
            (this_00,(vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>
                      *)&local_240);
  puVar21 = (undefined8 *)local_2b0;
  pvVar22 = this_00 + 1;
  for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pvVar22->
    super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar21;
    puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
    pvVar22 = (vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
              ((long)pvVar22 + ((ulong)bVar24 * -2 + 1) * 8);
  }
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            ((vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_> *)
             &local_240);
  _Var9._M_head_impl = local_b8._M_head_impl;
  local_88._M_t.super__Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>.
  super__Head_base<0UL,_FBX::Scene_*,_false>._M_head_impl =
       (tuple<FBX::Scene_*,_std::default_delete<FBX::Scene>_>)
       (_Tuple_impl<0UL,_FBX::Scene_*,_std::default_delete<FBX::Scene>_>)0x0;
  ((local_b8._M_head_impl)->models).
  super__Vector_base<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  std::unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_>::~unique_ptr
            ((unique_ptr<FBX::Scene,_std::default_delete<FBX::Scene>_> *)&local_88);
  std::vector<std::shared_ptr<FBX::Model>,_std::allocator<std::shared_ptr<FBX::Model>_>_>::~vector
            (&local_258);
  std::vector<std::shared_ptr<FBX::Mesh>,_std::allocator<std::shared_ptr<FBX::Mesh>_>_>::~vector
            (&local_228);
  std::vector<std::shared_ptr<FBX::Material>,_std::allocator<std::shared_ptr<FBX::Material>_>_>::
  ~vector(&local_f8);
  std::vector<std::shared_ptr<FBX::Texture>,_std::allocator<std::shared_ptr<FBX::Texture>_>_>::
  ~vector(&local_d8);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_1a0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_188);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_a0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_170);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_110);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
            ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)(local_138 + 0x10));
  if ((pointer)local_148._M_allocated_capacity != (pointer)local_138) {
    operator_delete((void *)local_148._M_allocated_capacity,local_138._0_8_ + 1);
  }
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1c0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_1d8);
  if ((double *)local_1f8._M_allocated_capacity != local_1e8) {
    operator_delete((void *)local_1f8._M_allocated_capacity,(long)local_1e8[0] + 1);
  }
  return (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         (__uniq_ptr_data<const_FBX::Scene,_std::default_delete<const_FBX::Scene>,_true,_true>)
         _Var9._M_head_impl;
}

Assistant:

std::unique_ptr<const Scene> Parser::parseScene() const {
        Settings settings(findNodes(root, "GlobalSettings")[0]);

        const auto nodeObjects = findNodes(root, "Objects")[0];
        const auto nodeConnections = findNodes(root, "Connections")[0];
        const auto nodeModels = findNodes(nodeObjects, "Model");
        const auto nodeGeometry = findNodes(nodeObjects, "Geometry");
        const auto nodeMaterials = findNodes(nodeObjects, "Material");
        const auto nodeTextures = findNodes(nodeObjects, "Texture");

        std::vector<std::shared_ptr<Texture>> textures{};
        textures.reserve(nodeTextures.size());
        for (const auto &node : nodeTextures)
            textures.emplace_back(new Texture(node));

        std::vector<std::shared_ptr<Material>> materials{};
        materials.reserve(nodeMaterials.size());
        for (const auto &node : nodeMaterials)
            materials.emplace_back(new Material(node));

        std::vector<std::shared_ptr<Mesh>> meshes;
        for (const auto &node : nodeGeometry)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                meshes.push_back(parseMesh(node, {})); // TODO

        std::vector<std::shared_ptr<Model>> models;
        models.reserve(nodeModels.size());
        for (const auto &node : nodeModels)
            if (std::get<std::string>(node.properties[2]) == "Mesh")
                models.emplace_back(new Model(node));

        for (const auto &node : nodeConnections.children) {
            const auto source = std::get<int64_t>(node.properties[1]);
            const auto target = std::get<int64_t>(node.properties[2]);

            for (const auto &material : materials) {
                for (const auto &texture : textures)
                    if (source == texture->id && target == material->id)
                        material->texture = texture;

                for (const auto &model : models)
                    if (source == material->id && target == model->id)
                        model->material = material;
            }

            for (const auto &mesh : meshes)
                for (const auto &model : models)
                    if (source == mesh->id && target == model->id)
                        model->mesh = mesh;
        }

        return std::make_unique<Scene>(models, settings);
    }